

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O2

int32_t conv_mcnp6_pdg2ssw(int32_t c)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int32_t *piVar4;
  long lVar5;
  uint uVar6;
  
  uVar1 = c;
  if (c < 1) {
    uVar1 = -c;
  }
  if (uVar1 < 0x3b9b1849) {
    if (c == -0xb) {
      uVar3 = 7;
      goto LAB_0010381f;
    }
    piVar4 = conv_mcnp6_to_pdg_0to36;
    for (uVar3 = 0; uVar3 != 0x4a; uVar3 = uVar3 + 2) {
      if (*piVar4 == c) goto LAB_0010381f;
      piVar4 = piVar4 + 1;
    }
    uVar3 = 1;
    for (lVar5 = 0; lVar5 != 0x94; lVar5 = lVar5 + 4) {
      if (*(uint *)((long)conv_mcnp6_to_pdg_0to36 + lVar5) == -c) goto LAB_0010381f;
      uVar3 = (ulong)((int)uVar3 + 2);
    }
  }
  uVar3 = 0;
  if (uVar1 + 0xc46535ff < 0x989676) {
    uVar3 = 0;
    iVar2 = (int)(((ulong)uVar1 / 10000) % 1000);
    uVar6 = (uint)(((ulong)uVar1 / 10) % 1000);
    if (iVar2 - 1U < uVar6) {
      uVar3 = (ulong)(iVar2 * 0x10000 + (uVar1 % 10 << 0x17 | (uint)c >> 0x1f | uVar6 << 7) + 0x4a);
    }
  }
LAB_0010381f:
  return (int32_t)uVar3;
}

Assistant:

int32_t conv_mcnp6_pdg2ssw( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (absc <= 1000020040) {
    if (c==-11)
      return 7;//e+ is special case, pick 7 (anti e-) rather than 16 (straight e+)
    int i;
    for (i = 0; i<37; ++i) {
      if (conv_mcnp6_to_pdg_0to36[i]==c)
        return 2*i;
    }
    for (i = 0; i<37; ++i) {
      if (conv_mcnp6_to_pdg_0to36[i] == -c)
        return 1 + 2*i;
    }
  }
  if (absc>1000000000&&absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=0 ions here.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    assert(absc/1000==100);//L=0 guaranteed by enclosing condition.
    if ( !A || !Z || Z>A )
      return 0;
    int32_t res = (c<0?1:0);
    res += 2*37;
    res += 128*A;
    res += 128*512*Z;
    res += 128*512*128*I;
    return res;
  }
  return 0;
}